

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O2

Value * __thiscall soul::heart::ProcessorProperty::getAsConstant(ProcessorProperty *this)

{
  Value *in_RDI;
  
  (in_RDI->type).structure.object = (Structure *)0x0;
  (in_RDI->allocatedData).allocatedSize = 0;
  (in_RDI->type).category = invalid;
  (in_RDI->type).arrayElementCategory = invalid;
  (in_RDI->type).isRef = false;
  (in_RDI->type).isConstant = false;
  (in_RDI->type).primitiveType = invalid;
  (in_RDI->type).boundingSize = 0;
  (in_RDI->type).arrayElementBoundingSize = 0;
  (in_RDI->allocatedData).allocatedData.items = (uchar *)(in_RDI->allocatedData).allocatedData.space
  ;
  (in_RDI->allocatedData).allocatedData.numActive = 0;
  (in_RDI->allocatedData).allocatedData.numAllocated = 8;
  return in_RDI;
}

Assistant:

Value getAsConstant() const override                              { return {}; }